

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_LayoutData.H
# Opt level: O0

void __thiscall
amrex::
LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::FArrayBox>,_std::allocator<amrex::FabCopyTag<amrex::FArrayBox>_>_>_>
::define(LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::FArrayBox>,_std::allocator<amrex::FabCopyTag<amrex::FArrayBox>_>_>_>
         *this,BoxArray *a_grids,DistributionMapping *a_dm)

{
  FabArrayBase *in_RSI;
  size_type in_RDI;
  vector<amrex::Vector<amrex::FabCopyTag<amrex::FArrayBox>,_std::allocator<amrex::FabCopyTag<amrex::FArrayBox>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::FArrayBox>,_std::allocator<amrex::FabCopyTag<amrex::FArrayBox>_>_>_>_>
  *unaff_retaddr;
  BoxArray *in_stack_00000008;
  size_type __new_size;
  
  __new_size = in_RDI;
  FabArrayBase::define
            ((FabArrayBase *)a_dm,in_stack_00000008,(DistributionMapping *)unaff_retaddr,
             (int)(in_RDI >> 0x20),(int)in_RDI);
  *(undefined1 *)(in_RDI + 0x108) = 1;
  FabArrayBase::addThisBD(in_RSI);
  FabArrayBase::local_size((FabArrayBase *)0x5d236a);
  std::
  vector<amrex::Vector<amrex::FabCopyTag<amrex::FArrayBox>,_std::allocator<amrex::FabCopyTag<amrex::FArrayBox>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::FArrayBox>,_std::allocator<amrex::FabCopyTag<amrex::FArrayBox>_>_>_>_>
  ::resize(unaff_retaddr,__new_size);
  return;
}

Assistant:

void define(const BoxArray           & a_grids,
                const DistributionMapping & a_dm)
      {
        FabArrayBase::define(a_grids, a_dm, 1, 0);
        m_need_to_clear_bd = true;
        addThisBD();
        m_data.resize(local_size());
      }